

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutahedral_representation_iterators.h
# Opt level: O1

void __thiscall
Gudhi::coxeter_triangulation::
Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
::increment(Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            *this)

{
  pointer pOVar1;
  pointer pOVar2;
  pointer pvVar3;
  ulong uVar4;
  pointer this_00;
  long lVar5;
  uint local_3c;
  unsigned_long local_38;
  
  if (this->k_ == 0xffffffff) {
    uVar4 = 0;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    do {
      pOVar1 = (this->o_its_).
               super__Vector_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
               ._M_impl.super__Vector_impl_data._M_start;
      Ordered_set_partition_iterator::increment
                ((Ordered_set_partition_iterator *)
                 ((long)&(pOVar1->s_end_).value_.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 + lVar5));
      if (((&pOVar1->is_end_)[lVar5] != true) || (((this->o_end_).is_end_ & 1U) == 0)) break;
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x138;
    } while (uVar4 < this->k_ + 1);
  }
  if ((int)uVar4 == this->k_ + 1) {
    Integer_combination_iterator::increment(&this->i_it_);
    if (((this->i_it_).is_end_ == true) && (((this->i_end_).is_end_ & 1U) != 0)) {
      this->is_end_ = true;
      return;
    }
    pOVar1 = (this->o_its_).
             super__Vector_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pOVar2 = (this->o_its_).
             super__Vector_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = pOVar1;
    if (pOVar2 != pOVar1) {
      do {
        Ordered_set_partition_iterator::~Ordered_set_partition_iterator(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pOVar2);
      (this->o_its_).
      super__Vector_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
      ._M_impl.super__Vector_impl_data._M_finish = pOVar1;
    }
    if (this->k_ != 0xffffffff) {
      lVar5 = 2;
      uVar4 = 0;
      do {
        pvVar3 = (this->simplex_).partition_.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_38 = *(long *)((long)&(pvVar3->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data + lVar5 * 4) -
                   *(long *)((long)pvVar3 + lVar5 * 4 + -8) >> 3;
        local_3c = (this->i_it_).value_.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4] + 1;
        std::
        vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>>
        ::emplace_back<unsigned_long,unsigned_int>
                  ((vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>>
                    *)&this->o_its_,&local_38,&local_3c);
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 6;
      } while (uVar4 < this->k_ + 1);
    }
  }
  else if ((int)uVar4 != 0) {
    lVar5 = 0;
    do {
      pOVar1 = (this->o_its_).
               super__Vector_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (&pOVar1->is_end_)[lVar5] = false;
      if (*(int *)((long)&(pOVar1->value_).p_it_.n_ + lVar5) != 0) {
        *(undefined1 *)((long)&(pOVar1->value_).p_it_.is_end_ + lVar5) = 0;
      }
      Set_partition_iterator::reinitialize
                ((Set_partition_iterator *)((long)&(pOVar1->value_).s_it_.value_ + lVar5));
      lVar5 = lVar5 + 0x138;
    } while ((uVar4 & 0xffffffff) * 0x138 - lVar5 != 0);
  }
  update_value(this);
  return;
}

Assistant:

void increment() {
    uint i = 0;
    for (; i < k_ + 1; i++) {
      if (++(o_its_[i]) != o_end_) break;
    }
    if (i == k_ + 1) {
      if (++i_it_ == i_end_) {
        is_end_ = true;
        return;
      }
      o_its_.clear();
      for (uint j = 0; j < k_ + 1; j++)
        o_its_.emplace_back(simplex_.partition()[j].size(), (*i_it_)[j] + 1);
    } else
      for (uint j = 0; j < i; j++) o_its_[j].reinitialize();
    update_value();
  }